

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pa_front.c
# Opt level: O1

int FindHostApi(PaDeviceIndex device,int *hostSpecificDeviceIndex)

{
  int iVar1;
  ulong uVar2;
  ulong uVar3;
  int iVar4;
  bool bVar5;
  
  iVar1 = -1;
  if ((-1 < device) && (initializationCount_ != 0)) {
    uVar3 = (ulong)hostApisCount_;
    bVar5 = 0 < (long)uVar3;
    if (0 < (long)uVar3) {
      iVar4 = ((*hostApis_)->info).deviceCount;
      uVar2 = 0;
      if (iVar4 <= device) {
        uVar2 = 0;
        do {
          if (uVar3 - 1 == uVar2) {
            return -1;
          }
          device = device - iVar4;
          iVar4 = (hostApis_[uVar2 + 1]->info).deviceCount;
          uVar2 = uVar2 + 1;
        } while (iVar4 <= device);
        bVar5 = uVar2 < uVar3;
      }
      if (bVar5) {
        if (hostSpecificDeviceIndex != (int *)0x0) {
          *hostSpecificDeviceIndex = device;
        }
        iVar1 = (int)uVar2;
      }
    }
  }
  return iVar1;
}

Assistant:

static int FindHostApi( PaDeviceIndex device, int *hostSpecificDeviceIndex )
{
    int i=0;

    if( !PA_IS_INITIALISED_ )
        return -1;

    if( device < 0 )
        return -1;

    while( i < hostApisCount_
            && device >= hostApis_[i]->info.deviceCount )
    {

        device -= hostApis_[i]->info.deviceCount;
        ++i;
    }

    if( i >= hostApisCount_ )
        return -1;

    if( hostSpecificDeviceIndex )
        *hostSpecificDeviceIndex = device;

    return i;
}